

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-xml-cpp.cpp
# Opt level: O1

bool string_equals(xml_string *a,char *b)

{
  size_t length;
  size_t sVar1;
  uint8_t *buffer;
  size_t sVar2;
  bool bVar3;
  ostream *poVar4;
  
  length = xml_string_length(a);
  sVar1 = strlen(b);
  buffer = (uint8_t *)operator_new__(length + 1);
  xml_string_copy(a,buffer,length);
  buffer[length] = '\0';
  if (length == sVar1) {
    bVar3 = true;
    if (length != 0) {
      sVar2 = 0;
      do {
        if ((uint)buffer[sVar2] != (int)b[sVar2]) {
          poVar4 = (ostream *)&std::cerr;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"string_equals: ",0xf);
          sVar1 = strlen((char *)buffer);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,(char *)buffer,sVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," <> ",4);
          if (b == (char *)0x0) {
            poVar4 = (ostream *)&std::cerr;
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x108100);
          }
          else {
            sVar1 = strlen(b);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,b,sVar1);
          }
          goto LAB_00102b95;
        }
        sVar2 = sVar2 + 1;
      } while (length != sVar2);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"string_equals: ",0xf);
    sVar1 = strlen((char *)buffer);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,(char *)buffer,sVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"#",1);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," <> ",4);
    if (b == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar1 = strlen(b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,b,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"#",1);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
LAB_00102b95:
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    bVar3 = false;
  }
  operator_delete__(buffer);
  return bVar3;
}

Assistant:

static bool string_equals(struct xml_string* a, const char* b) {
	size_t a_length = xml_string_length(a);
	size_t b_length = strlen(b);
	uint8_t* a_buffer = new uint8_t[((a_length + 1) * sizeof(uint8_t))];
	xml_string_copy(a, a_buffer, a_length);
	a_buffer[a_length] = 0;
	if (a_length != b_length) {
		std::cerr << "string_equals: " << a_buffer << "#" << a_length << " <> "
		  << b << "#" << b_length << "\n";
		delete[] a_buffer;
		return false;
	}
	size_t i = 0; for (; i < a_length; ++i) {
		if (a_buffer[i] != b[i]) {
			std::cerr << "string_equals: " << a_buffer << " <> " << b << "\n";
			delete[] a_buffer;
			return false;
		}
	}
	delete[] a_buffer;
	return true;
}